

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_stroke_poly_line
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_draw_list_stroke closed,float thickness,nk_anti_aliasing aliasing)

{
  undefined8 *puVar1;
  nk_vec2 nVar2;
  uint uVar3;
  nk_buffer *pnVar4;
  void *pvVar5;
  nk_size nVar6;
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  short sVar11;
  short sVar12;
  nk_draw_index nVar13;
  int iVar14;
  void *pvVar15;
  nk_draw_index *pnVar16;
  undefined8 *puVar17;
  ulong uVar18;
  nk_size nVar19;
  nk_draw_index nVar20;
  uint uVar21;
  ulong uVar22;
  nk_draw_index nVar23;
  float fVar24;
  uint uVar25;
  nk_draw_index nVar26;
  ulong uVar27;
  nk_draw_index nVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  nk_vec2 *pnVar32;
  bool bVar33;
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_vec2 pos_01;
  nk_vec2 pos_02;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  nk_colorf color_03;
  nk_colorf color_04;
  nk_colorf color_05;
  nk_colorf color_06;
  nk_colorf color_07;
  nk_colorf color_08;
  nk_colorf color_09;
  nk_colorf color_10;
  
  if (points_count < 2 || list == (nk_draw_list *)0x0) {
    return;
  }
  fVar34 = (list->config).global_alpha;
  uVar31 = (ulong)points_count;
  uVar25 = points_count - 1;
  uVar18 = (ulong)uVar25;
  uVar30 = uVar31;
  if (closed == NK_STROKE_OPEN) {
    uVar30 = uVar18;
  }
  iVar14 = (int)((float)((int)((float)((uint)color >> 0x18) * fVar34) & 0xff) * fVar34);
  fVar34 = (float)((uint)color & 0xff) * 0.003921569;
  fVar36 = (float)((uint)color >> 8 & 0xff) * 0.003921569;
  uVar27 = (ulong)color._2_2_ & 0xffffffffffff00ff;
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar27;
  auVar7[0xc] = (char)((uint)iVar14 >> 0x10);
  auVar8[8] = (char)((uint)iVar14 >> 8);
  auVar8._0_8_ = uVar27;
  auVar8[9] = 0;
  auVar8._10_3_ = auVar7._10_3_;
  auVar10._5_8_ = 0;
  auVar10._0_5_ = auVar8._8_5_;
  auVar9[4] = (char)iVar14;
  auVar9._0_4_ = (int)uVar27;
  auVar9[5] = 0;
  auVar9._6_7_ = SUB137(auVar10 << 0x40,6);
  fVar35 = (float)(int)uVar27 * 0.003921569;
  fVar37 = (float)auVar9._4_4_ * 0.003921569;
  uVar3 = list->vertex_count;
  if (aliasing != NK_ANTI_ALIASING_ON) {
    pvVar15 = nk_draw_list_alloc_vertices(list,uVar30 * 4);
    pnVar16 = nk_draw_list_alloc_elements(list,uVar30 * 6);
    if (pnVar16 == (nk_draw_index *)0x0 || pvVar15 == (void *)0x0) {
      return;
    }
    lVar29 = 0;
    uVar18 = 1;
    do {
      uVar27 = 0;
      if (uVar31 != uVar18) {
        uVar27 = uVar18;
      }
      fVar24 = *(float *)((long)&points->x + lVar29 * 2);
      fVar41 = *(float *)((long)&points->y + lVar29 * 2);
      fVar42 = points[uVar27].x;
      fVar43 = points[uVar27].y;
      fVar38 = fVar42 - fVar24;
      fVar39 = fVar43 - fVar41;
      fVar44 = fVar38 * fVar38 + fVar39 * fVar39;
      fVar40 = 1.0;
      if ((fVar44 != 0.0) || (NAN(fVar44))) {
        fVar40 = (float)(0x5f375a84 - ((uint)fVar44 >> 1));
        fVar40 = (fVar44 * -0.5 * fVar40 * fVar40 + 1.5) * fVar40;
      }
      sVar11 = (short)uVar3;
      sVar12 = (short)lVar29;
      nVar2 = (list->config).null.uv;
      fVar44 = fVar38 * fVar40 * thickness * 0.5;
      fVar40 = fVar39 * fVar40 * thickness * 0.5;
      pos.x = fVar24 + fVar40;
      pos.y = fVar41 - fVar44;
      color_00.g = fVar36;
      color_00.r = fVar34;
      color_00.a = fVar37;
      color_00.b = fVar35;
      pvVar15 = nk_draw_vertex(pvVar15,(nk_convert_config *)(list->config).vertex_layout,pos,nVar2,
                               color_00);
      pos_00.x = fVar42 + fVar40;
      pos_00.y = fVar43 - fVar44;
      color_01.g = fVar36;
      color_01.r = fVar34;
      color_01.a = fVar37;
      color_01.b = fVar35;
      pvVar15 = nk_draw_vertex(pvVar15,(nk_convert_config *)(list->config).vertex_layout,pos_00,
                               nVar2,color_01);
      pos_01.x = fVar42 - fVar40;
      pos_01.y = fVar43 + fVar44;
      color_02.g = fVar36;
      color_02.r = fVar34;
      color_02.a = fVar37;
      color_02.b = fVar35;
      pvVar15 = nk_draw_vertex(pvVar15,(nk_convert_config *)(list->config).vertex_layout,pos_01,
                               nVar2,color_02);
      pos_02.x = fVar24 - fVar40;
      pos_02.y = fVar44 + fVar41;
      color_03.g = fVar36;
      color_03.r = fVar34;
      color_03.a = fVar37;
      color_03.b = fVar35;
      pvVar15 = nk_draw_vertex(pvVar15,(nk_convert_config *)(list->config).vertex_layout,pos_02,
                               nVar2,color_03);
      *pnVar16 = sVar11 + sVar12;
      pnVar16[1] = sVar11 + sVar12 + 1;
      nVar13 = sVar11 + 2 + sVar12;
      pnVar16[2] = nVar13;
      pnVar16[3] = sVar11 + sVar12;
      pnVar16[4] = nVar13;
      pnVar16[5] = sVar11 + sVar12 + 3;
      pnVar16 = pnVar16 + 6;
      lVar29 = lVar29 + 4;
      bVar33 = uVar18 != uVar30;
      uVar18 = uVar18 + 1;
    } while (bVar33);
    return;
  }
  lVar29 = 0xc;
  if (1.0 < thickness) {
    lVar29 = 0x12;
  }
  uVar21 = points_count * 3;
  if (1.0 < thickness) {
    uVar21 = points_count * 4;
  }
  pvVar15 = nk_draw_list_alloc_vertices(list,(ulong)uVar21);
  pnVar16 = nk_draw_list_alloc_elements(list,lVar29 * uVar30);
  if (pvVar15 == (void *)0x0) {
    return;
  }
  if (pnVar16 == (nk_draw_index *)0x0) {
    return;
  }
  pnVar4 = list->vertices;
  pvVar5 = (pnVar4->memory).ptr;
  nVar6 = pnVar4->allocated;
  pnVar4->marker[0].active = 1;
  pnVar4->marker[0].offset = nVar6;
  puVar17 = (undefined8 *)
            nk_buffer_alloc(pnVar4,NK_BUFFER_FRONT,((ulong)(1.0 < thickness) * 0x10 + 0x18) * uVar31
                            ,4);
  if (puVar17 == (undefined8 *)0x0) {
    return;
  }
  puVar1 = puVar17 + uVar31;
  pvVar15 = (void *)((long)pvVar15 + ((long)(list->vertices->memory).ptr - (long)pvVar5));
  uVar27 = 1;
  do {
    uVar22 = uVar27;
    if (uVar31 == uVar27) {
      uVar22 = 0;
    }
    fVar42 = points[uVar22].x - points[uVar27 - 1].x;
    fVar41 = points[uVar22].y - points[uVar27 - 1].y;
    fVar43 = fVar42 * fVar42 + fVar41 * fVar41;
    fVar24 = 1.0;
    if ((fVar43 != 0.0) || (NAN(fVar43))) {
      fVar24 = (float)(0x5f375a84 - ((uint)fVar43 >> 1));
      fVar24 = (fVar43 * -0.5 * fVar24 * fVar24 + 1.5) * fVar24;
    }
    puVar17[uVar27 - 1] = CONCAT44(fVar24 * -fVar42,fVar24 * fVar41);
    bVar33 = uVar27 != uVar30;
    uVar27 = uVar27 + 1;
  } while (bVar33);
  if (closed == NK_STROKE_OPEN) {
    puVar17[uVar18] = puVar17[points_count - 2];
    if (1.0 < thickness) {
      fVar44 = (thickness + -1.0) * 0.5;
      fVar24 = fVar44 + 1.0;
      fVar41 = (float)*puVar17;
      fVar43 = fVar24 * fVar41;
      fVar42 = (float)((ulong)*puVar17 >> 0x20);
      fVar40 = fVar24 * fVar42;
      *puVar1 = CONCAT44((*points).y + fVar40,(*points).x + fVar43);
      fVar41 = fVar41 * fVar44;
      fVar42 = fVar42 * fVar44;
      puVar1[1] = CONCAT44((*points).y + fVar42,(*points).x + fVar41);
      puVar1[2] = CONCAT44((*points).y - fVar42,(*points).x - fVar41);
      puVar1[3] = CONCAT44((*points).y - fVar40,(*points).x - fVar43);
      uVar27 = (ulong)(uVar25 * 4);
      fVar42 = (float)puVar17[uVar18];
      fVar41 = fVar24 * fVar42;
      fVar43 = (float)((ulong)puVar17[uVar18] >> 0x20);
      fVar24 = fVar24 * fVar43;
      puVar1[uVar27] = CONCAT44(points[uVar18].y + fVar24,points[uVar18].x + fVar41);
      fVar42 = fVar44 * fVar42;
      fVar43 = fVar44 * fVar43;
      puVar1[uVar27 + 1] = CONCAT44(points[uVar18].y + fVar43,points[uVar18].x + fVar42);
      puVar1[uVar27 + 2] = CONCAT44(points[uVar18].y - fVar43,points[uVar18].x - fVar42);
      puVar1[uVar27 + 3] = CONCAT44(points[uVar18].y - fVar24,points[uVar18].x - fVar41);
      goto LAB_0010b452;
    }
    *puVar1 = CONCAT44((*points).y + (float)((ulong)*puVar17 >> 0x20),(*points).x + (float)*puVar17)
    ;
    puVar1[1] = CONCAT44((*points).y - (float)((ulong)*puVar17 >> 0x20),
                         (*points).x - (float)*puVar17);
    fVar24 = (float)puVar17[uVar18];
    fVar41 = (float)((ulong)puVar17[uVar18] >> 0x20);
    puVar1[uVar25 * 2] = CONCAT44(points[uVar18].y + fVar41,points[uVar18].x + fVar24);
    puVar1[(ulong)(uVar25 * 2) + 1] = CONCAT44(points[uVar18].y - fVar41,points[uVar18].x - fVar24);
  }
  else if (1.0 < thickness) {
    fVar44 = (thickness + -1.0) * 0.5;
LAB_0010b452:
    uVar18 = 1;
    uVar25 = uVar3;
    do {
      uVar27 = uVar18;
      uVar21 = uVar25 + 4;
      if (uVar31 == uVar18) {
        uVar27 = 0;
        uVar21 = uVar3;
      }
      fVar24 = ((float)puVar17[uVar27] + (float)puVar17[uVar18 - 1]) * 0.5;
      fVar41 = ((float)((ulong)puVar17[uVar27] >> 0x20) +
               (float)((ulong)puVar17[uVar18 - 1] >> 0x20)) * 0.5;
      fVar42 = fVar24 * fVar24 + fVar41 * fVar41;
      if (1e-06 < fVar42) {
        fVar42 = 1.0 / fVar42;
        fVar43 = 100.0;
        if (fVar42 <= 100.0) {
          fVar43 = fVar42;
        }
        fVar24 = fVar24 * fVar43;
        fVar41 = fVar41 * fVar43;
      }
      fVar42 = (fVar44 + 1.0) * fVar24;
      fVar43 = (fVar44 + 1.0) * fVar41;
      puVar1[uVar27 * 4] = CONCAT44(points[uVar27].y + fVar43,points[uVar27].x + fVar42);
      puVar1[uVar27 * 4 + 1] =
           CONCAT44(points[uVar27].y + fVar41 * fVar44,points[uVar27].x + fVar24 * fVar44);
      puVar1[uVar27 * 4 + 2] =
           CONCAT44(points[uVar27].y - fVar41 * fVar44,points[uVar27].x - fVar24 * fVar44);
      puVar1[uVar27 * 4 + 3] = CONCAT44(points[uVar27].y - fVar43,points[uVar27].x - fVar42);
      nVar13 = (nk_draw_index)uVar21;
      nVar26 = nVar13 + 1;
      *pnVar16 = nVar26;
      nVar23 = (nk_draw_index)uVar25;
      pnVar16[1] = nVar23 + 1;
      nVar28 = nVar23 + 2;
      pnVar16[2] = nVar28;
      pnVar16[3] = nVar28;
      nVar20 = nVar13 + 2;
      pnVar16[4] = nVar20;
      pnVar16[5] = nVar26;
      pnVar16[6] = nVar26;
      pnVar16[7] = nVar23 + 1;
      pnVar16[8] = nVar23;
      pnVar16[9] = nVar23;
      pnVar16[10] = nVar13;
      pnVar16[0xb] = nVar26;
      pnVar16[0xc] = nVar20;
      pnVar16[0xd] = nVar28;
      pnVar16[0xe] = nVar23 + 3;
      pnVar16[0xf] = nVar23 + 3;
      pnVar16[0x10] = nVar13 + 3;
      pnVar16[0x11] = nVar20;
      pnVar16 = pnVar16 + 0x12;
      bVar33 = uVar18 != uVar30;
      uVar18 = uVar18 + 1;
      uVar25 = uVar21;
    } while (bVar33);
    pnVar32 = (nk_vec2 *)(puVar17 + uVar31 + 3);
    do {
      nVar2 = (list->config).null.uv;
      color_04.g = fVar36;
      color_04.r = fVar34;
      color_04.b = fVar35;
      color_04.a = 0.0;
      pvVar15 = nk_draw_vertex(pvVar15,(nk_convert_config *)(list->config).vertex_layout,pnVar32[-3]
                               ,nVar2,color_04);
      color_05.g = fVar36;
      color_05.r = fVar34;
      color_05.a = fVar37;
      color_05.b = fVar35;
      pvVar15 = nk_draw_vertex(pvVar15,(nk_convert_config *)(list->config).vertex_layout,pnVar32[-2]
                               ,nVar2,color_05);
      color_06.g = fVar36;
      color_06.r = fVar34;
      color_06.a = fVar37;
      color_06.b = fVar35;
      pvVar15 = nk_draw_vertex(pvVar15,(nk_convert_config *)(list->config).vertex_layout,pnVar32[-1]
                               ,nVar2,color_06);
      color_07.g = fVar36;
      color_07.r = fVar34;
      color_07.b = fVar35;
      color_07.a = 0.0;
      pvVar15 = nk_draw_vertex(pvVar15,(nk_convert_config *)(list->config).vertex_layout,*pnVar32,
                               nVar2,color_07);
      pnVar32 = pnVar32 + 4;
      uVar31 = uVar31 - 1;
    } while (uVar31 != 0);
    goto LAB_0010b8ac;
  }
  uVar18 = 1;
  uVar25 = uVar3;
  do {
    uVar27 = uVar18;
    uVar21 = uVar25 + 3;
    if (uVar31 == uVar18) {
      uVar27 = 0;
      uVar21 = uVar3;
    }
    fVar24 = ((float)puVar17[uVar27] + (float)puVar17[uVar18 - 1]) * 0.5;
    fVar41 = ((float)((ulong)puVar17[uVar27] >> 0x20) + (float)((ulong)puVar17[uVar18 - 1] >> 0x20))
             * 0.5;
    fVar42 = fVar24 * fVar24 + fVar41 * fVar41;
    if (1e-06 < fVar42) {
      fVar42 = 1.0 / fVar42;
      fVar43 = 100.0;
      if (fVar42 <= 100.0) {
        fVar43 = fVar42;
      }
      fVar24 = fVar24 * fVar43;
      fVar41 = fVar41 * fVar43;
    }
    puVar1[uVar27 * 2] = CONCAT44(points[uVar27].y + fVar41,points[uVar27].x + fVar24);
    puVar1[uVar27 * 2 + 1] = CONCAT44(points[uVar27].y - fVar41,points[uVar27].x - fVar24);
    nVar13 = (nk_draw_index)uVar21;
    *pnVar16 = nVar13;
    nVar23 = (nk_draw_index)uVar25;
    pnVar16[1] = nVar23;
    pnVar16[2] = nVar23 + 2;
    pnVar16[3] = nVar23 + 2;
    pnVar16[4] = nVar13 + 2;
    pnVar16[5] = nVar13;
    pnVar16[6] = nVar13 + 1;
    pnVar16[7] = nVar23 + 1;
    pnVar16[8] = nVar23;
    pnVar16[9] = nVar23;
    pnVar16[10] = nVar13;
    pnVar16[0xb] = nVar13 + 1;
    pnVar16 = pnVar16 + 0xc;
    bVar33 = uVar18 != uVar30;
    uVar18 = uVar18 + 1;
    uVar25 = uVar21;
  } while (bVar33);
  pnVar32 = (nk_vec2 *)(puVar17 + uVar31 + 1);
  uVar30 = 0;
  do {
    nVar2 = (list->config).null.uv;
    color_08.g = fVar36;
    color_08.r = fVar34;
    color_08.a = fVar37;
    color_08.b = fVar35;
    pvVar15 = nk_draw_vertex(pvVar15,(nk_convert_config *)(list->config).vertex_layout,
                             points[uVar30],nVar2,color_08);
    color_09.g = fVar36;
    color_09.r = fVar34;
    color_09.b = fVar35;
    color_09.a = 0.0;
    pvVar15 = nk_draw_vertex(pvVar15,(nk_convert_config *)(list->config).vertex_layout,pnVar32[-1],
                             nVar2,color_09);
    color_10.g = fVar36;
    color_10.r = fVar34;
    color_10.b = fVar35;
    color_10.a = 0.0;
    pvVar15 = nk_draw_vertex(pvVar15,(nk_convert_config *)(list->config).vertex_layout,*pnVar32,
                             nVar2,color_10);
    uVar30 = uVar30 + 1;
    pnVar32 = pnVar32 + 2;
  } while (uVar31 != uVar30);
LAB_0010b8ac:
  pnVar4 = list->vertices;
  if (pnVar4 != (nk_buffer *)0x0) {
    nVar6 = pnVar4->marker[0].offset;
    pnVar4->needed = pnVar4->needed + (nVar6 - pnVar4->allocated);
    nVar19 = 0;
    if (pnVar4->marker[0].active != 0) {
      nVar19 = nVar6;
    }
    pnVar4->allocated = nVar19;
    pnVar4->marker[0].active = 0;
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_poly_line(struct nk_draw_list *list, const struct nk_vec2 *points,
const unsigned int points_count, struct nk_color color, enum nk_draw_list_stroke closed,
float thickness, enum nk_anti_aliasing aliasing)
{
nk_size count;
int thick_line;
struct nk_colorf col;
struct nk_colorf col_trans;
NK_ASSERT(list);
if (!list || points_count < 2) return;

color.a = (nk_byte)((float)color.a * list->config.global_alpha);
count = points_count;
if (!closed) count = points_count-1;
thick_line = thickness > 1.0f;

#ifdef NK_INCLUDE_COMMAND_USERDATA
nk_draw_list_push_userdata(list, list->userdata);
#endif

color.a = (nk_byte)((float)color.a * list->config.global_alpha);
nk_color_fv(&col.r, color);
col_trans = col;
col_trans.a = 0;

if (aliasing == NK_ANTI_ALIASING_ON) {
/* ANTI-ALIASED STROKE */
const float AA_SIZE = 1.0f;
NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);

/* allocate vertices and elements  */
nk_size i1 = 0;
nk_size vertex_offset;
nk_size index = list->vertex_count;

const nk_size idx_count = (thick_line) ?  (count * 18) : (count * 12);
const nk_size vtx_count = (thick_line) ? (points_count * 4): (points_count *3);

void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

nk_size size;
struct nk_vec2 *normals, *temp;
if (!vtx || !ids) return;

/* temporary allocate normals + points */
vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
size = pnt_size * ((thick_line) ? 5 : 3) * points_count;
normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
if (!normals) return;
temp = normals + points_count;

/* make sure vertex pointer is still correct */
vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

/* calculate normals */
for (i1 = 0; i1 < count; ++i1) {
const nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
struct nk_vec2 diff = nk_vec2_sub(points[i2], points[i1]);
float len;

/* vec2 inverted length  */
len = nk_vec2_len_sqr(diff);
if (len != 0.0f)
len = nk_inv_sqrt(len);
else len = 1.0f;

diff = nk_vec2_muls(diff, len);
normals[i1].x = diff.y;
normals[i1].y = -diff.x;
}

if (!closed)
normals[points_count-1] = normals[points_count-2];

if (!thick_line) {
nk_size idx1, i;
if (!closed) {
struct nk_vec2 d;
temp[0] = nk_vec2_add(points[0], nk_vec2_muls(normals[0], AA_SIZE));
temp[1] = nk_vec2_sub(points[0], nk_vec2_muls(normals[0], AA_SIZE));
d = nk_vec2_muls(normals[points_count-1], AA_SIZE);
temp[(points_count-1) * 2 + 0] = nk_vec2_add(points[points_count-1], d);
temp[(points_count-1) * 2 + 1] = nk_vec2_sub(points[points_count-1], d);
}

/* fill elements */
idx1 = index;
for (i1 = 0; i1 < count; i1++) {
struct nk_vec2 dm;
float dmr2;
nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 3);

/* average normals */
dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
dmr2 = dm.x * dm.x + dm.y* dm.y;
if (dmr2 > 0.000001f) {
float scale = 1.0f/dmr2;
scale = NK_MIN(100.0f, scale);
dm = nk_vec2_muls(dm, scale);
}

dm = nk_vec2_muls(dm, AA_SIZE);
temp[i2*2+0] = nk_vec2_add(points[i2], dm);
temp[i2*2+1] = nk_vec2_sub(points[i2], dm);

ids[0] = (nk_draw_index)(idx2 + 0); ids[1] = (nk_draw_index)(idx1+0);
ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+0);
ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
ids[10]= (nk_draw_index)(idx2 + 0); ids[11]= (nk_draw_index)(idx2+1);
ids += 12;
idx1 = idx2;
}

/* fill vertices */
for (i = 0; i < points_count; ++i) {
const struct nk_vec2 uv = list->config.null.uv;
vtx = nk_draw_vertex(vtx, &list->config, points[i], uv, col);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+0], uv, col_trans);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+1], uv, col_trans);
}
} else {
nk_size idx1, i;
const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
if (!closed) {
struct nk_vec2 d1 = nk_vec2_muls(normals[0], half_inner_thickness + AA_SIZE);
struct nk_vec2 d2 = nk_vec2_muls(normals[0], half_inner_thickness);

temp[0] = nk_vec2_add(points[0], d1);
temp[1] = nk_vec2_add(points[0], d2);
temp[2] = nk_vec2_sub(points[0], d2);
temp[3] = nk_vec2_sub(points[0], d1);

d1 = nk_vec2_muls(normals[points_count-1], half_inner_thickness + AA_SIZE);
d2 = nk_vec2_muls(normals[points_count-1], half_inner_thickness);

temp[(points_count-1)*4+0] = nk_vec2_add(points[points_count-1], d1);
temp[(points_count-1)*4+1] = nk_vec2_add(points[points_count-1], d2);
temp[(points_count-1)*4+2] = nk_vec2_sub(points[points_count-1], d2);
temp[(points_count-1)*4+3] = nk_vec2_sub(points[points_count-1], d1);
}

/* add all elements */
idx1 = index;
for (i1 = 0; i1 < count; ++i1) {
struct nk_vec2 dm_out, dm_in;
const nk_size i2 = ((i1+1) == points_count) ? 0: (i1 + 1);
nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 4);

/* average normals */
struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
float dmr2 = dm.x * dm.x + dm.y* dm.y;
if (dmr2 > 0.000001f) {
float scale = 1.0f/dmr2;
scale = NK_MIN(100.0f, scale);
dm = nk_vec2_muls(dm, scale);
}

dm_out = nk_vec2_muls(dm, ((half_inner_thickness) + AA_SIZE));
dm_in = nk_vec2_muls(dm, half_inner_thickness);
temp[i2*4+0] = nk_vec2_add(points[i2], dm_out);
temp[i2*4+1] = nk_vec2_add(points[i2], dm_in);
temp[i2*4+2] = nk_vec2_sub(points[i2], dm_in);
temp[i2*4+3] = nk_vec2_sub(points[i2], dm_out);

/* add indexes */
ids[0] = (nk_draw_index)(idx2 + 1); ids[1] = (nk_draw_index)(idx1+1);
ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+1);
ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
ids[10]= (nk_draw_index)(idx2 + 0); ids[11] = (nk_draw_index)(idx2+1);
ids[12]= (nk_draw_index)(idx2 + 2); ids[13] = (nk_draw_index)(idx1+2);
ids[14]= (nk_draw_index)(idx1 + 3); ids[15] = (nk_draw_index)(idx1+3);
ids[16]= (nk_draw_index)(idx2 + 3); ids[17] = (nk_draw_index)(idx2+2);
ids += 18;
idx1 = idx2;
}

/* add vertices */
for (i = 0; i < points_count; ++i) {
const struct nk_vec2 uv = list->config.null.uv;
vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+0], uv, col_trans);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+1], uv, col);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+2], uv, col);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+3], uv, col_trans);
}
}
/* free temporary normals + points */
nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
} else {
/* NON ANTI-ALIASED STROKE */
nk_size i1 = 0;
nk_size idx = list->vertex_count;
const nk_size idx_count = count * 6;
const nk_size vtx_count = count * 4;
void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);
if (!vtx || !ids) return;

for (i1 = 0; i1 < count; ++i1) {
float dx, dy;
const struct nk_vec2 uv = list->config.null.uv;
const nk_size i2 = ((i1+1) == points_count) ? 0 : i1 + 1;
const struct nk_vec2 p1 = points[i1];
const struct nk_vec2 p2 = points[i2];
struct nk_vec2 diff = nk_vec2_sub(p2, p1);
float len;

/* vec2 inverted length  */
len = nk_vec2_len_sqr(diff);
if (len != 0.0f)
len = nk_inv_sqrt(len);
else len = 1.0f;
diff = nk_vec2_muls(diff, len);

/* add vertices */
dx = diff.x * (thickness * 0.5f);
dy = diff.y * (thickness * 0.5f);

vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x + dy, p1.y - dx), uv, col);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x + dy, p2.y - dx), uv, col);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x - dy, p2.y + dx), uv, col);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x - dy, p1.y + dx), uv, col);

ids[0] = (nk_draw_index)(idx+0); ids[1] = (nk_draw_index)(idx+1);
ids[2] = (nk_draw_index)(idx+2); ids[3] = (nk_draw_index)(idx+0);
ids[4] = (nk_draw_index)(idx+2); ids[5] = (nk_draw_index)(idx+3);

ids += 6;
idx += 4;
}
}
}